

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void AdditionHelper<unsigned_char,signed_char,5>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uchar *lhs,char *rhs,uchar *result)

{
  byte bVar1;
  int iVar2;
  undefined1 *in_RDX;
  char *in_RSI;
  byte *in_RDI;
  int32_t tmp;
  
  iVar2 = (uint)*in_RDI + (int)*in_RSI;
  bVar1 = std::numeric_limits<unsigned_char>::max();
  if (iVar2 <= (int)(uint)bVar1) {
    bVar1 = std::numeric_limits<unsigned_char>::min();
    if ((int)(uint)bVar1 <= iVar2) {
      *in_RDX = (char)iVar2;
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}